

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashtbl.c
# Opt level: O2

void * tommy_hashtable_remove
                 (tommy_hashtable *hashtable,undefined1 *cmp,void *cmp_arg,tommy_hash_t hash)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  tommy_node *node;
  uint uVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = hashtable->bucket_mask & hash;
  node = (tommy_node *)(hashtable->bucket + uVar4);
  do {
    do {
      node = node->next;
      if (node == (tommy_node *)0x0) {
        pvVar3 = (void *)0x0;
        goto LAB_0010f15d;
      }
    } while (node->key != hash);
    iVar2 = (*(code *)cmp)(cmp_arg,node->data);
  } while (iVar2 != 0);
  tommy_list_remove_existing(hashtable->bucket + uVar4,node);
  hashtable->count = hashtable->count - 1;
  pvVar3 = node->data;
LAB_0010f15d:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pvVar3;
  }
  __stack_chk_fail();
}

Assistant:

void* tommy_hashtable_remove(tommy_hashtable* hashtable, tommy_search_func* cmp, const void* cmp_arg, tommy_hash_t hash)
{
	tommy_count_t pos = hash & hashtable->bucket_mask;
	tommy_hashtable_node* node = hashtable->bucket[pos];

	while (node) {
		/* we first check if the hash matches, as in the same bucket we may have multiples hash values */
		if (node->key == hash && cmp(cmp_arg, node->data) == 0) {
			tommy_list_remove_existing(&hashtable->bucket[pos], node);

			--hashtable->count;

			return node->data;
		}
		node = node->next;
	}

	return 0;
}